

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O2

unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>_>_>
* Registry<std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>
  ::all(void)

{
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *__ht;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *in_RDI;
  
  __ht = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          *)instance();
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(in_RDI,__ht);
  return (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>_>_>
          *)in_RDI;
}

Assistant:

const std::unordered_map<std::string, T> Registry<T>::all()
{
    return instance().map;
}